

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

void __thiscall CTcEmbedTokenList::unget(CTcEmbedTokenList *this,int n,int m)

{
  int iVar1;
  int iVar2;
  CTcTokenEle *prv;
  int iVar3;
  
  iVar3 = this->cnt;
  prv = this->wrt->prv_;
  if (prv != (CTcTokenEle *)0x0 && m != 0) {
    iVar1 = 0;
    do {
      prv = prv->prv_;
      iVar2 = iVar1 + 1;
      if (m + -1 == iVar1) break;
      iVar1 = iVar2;
    } while (prv != (CTcTokenEle *)0x0);
    iVar3 = iVar3 - iVar2;
  }
  if (n < iVar3 && prv != (CTcTokenEle *)0x0) {
    do {
      iVar3 = iVar3 + -1;
      CTcTokenizer::unget(G_tok,&prv->super_CTcToken);
      prv = prv->prv_;
      if (prv == (CTcTokenEle *)0x0) {
        return;
      }
    } while (n < iVar3);
  }
  return;
}

Assistant:

void unget(int n = 0, int m = 0)
    {
        /* skip the last 'm' tokens */
        CTcTokenEle *ele;
        int i;
        for (ele = wrt->getprv(), i = cnt ; m != 0 && ele != 0 ;
             ele = ele->getprv(), --m, --i) ;

        /* unget tokens until we're down to the first 'n' */
        for ( ; ele != 0 && i > n ; ele = ele->getprv(), --i)
            G_tok->unget(ele);
    }